

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpls.cpp
# Opt level: O2

void adios2::utils::print_decomp_singlestep<long>(Engine *fp,IO *io,Variable<long> *variable)

{
  Variable<long> *pVVar1;
  _Vector_base<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_> *this;
  Variable<long> *pVVar2;
  DataType adiosvartype;
  long lVar3;
  Dims Start;
  uint uVar4;
  int iVar5;
  int __c;
  undefined8 uVar6;
  void *pvVar7;
  pointer pBVar8;
  ulong uVar9;
  Variable<long> *pVVar10;
  pointer pBVar11;
  long lVar12;
  undefined8 *puVar13;
  char *__format;
  int *piVar14;
  pointer data;
  map<unsigned_long,_std::vector<adios2::helper::SubStreamBoxInfo,_std::allocator<adios2::helper::SubStreamBoxInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubStreamBoxInfo,_std::allocator<adios2::helper::SubStreamBoxInfo>_>_>_>_>
  *data_00;
  size_t j;
  ulong uVar15;
  int iVar16;
  size_t k_1;
  ulong uVar17;
  size_t blockid;
  size_t k;
  long lVar18;
  byte bVar19;
  undefined8 in_stack_fffffffffffffeb0;
  vector<adios2::core::Variable<long>::BPInfo,_std::allocator<adios2::core::Variable<long>::BPInfo>_>
  coreBlocks;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_e8;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_d0;
  int ndigits_dims [32];
  
  bVar19 = 0;
  adiosvartype = *(DataType *)(variable + 0x28);
  uVar6 = (**(code **)(*(long *)fp + 0x20))();
  pvVar7 = (void *)(**(code **)(*(long *)fp + 0x58))(fp,variable,uVar6);
  coreBlocks.
  super__Vector_base<adios2::core::Variable<long>::BPInfo,_std::allocator<adios2::core::Variable<long>::BPInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  coreBlocks.
  super__Vector_base<adios2::core::Variable<long>::BPInfo,_std::allocator<adios2::core::Variable<long>::BPInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  coreBlocks.
  super__Vector_base<adios2::core::Variable<long>::BPInfo,_std::allocator<adios2::core::Variable<long>::BPInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (pvVar7 == (void *)0x0) {
    (**(code **)(*(long *)fp + 0x20))(fp);
    adios2::core::Engine::BlocksInfo<long>((Variable *)ndigits_dims,(ulong)fp);
    std::
    vector<adios2::core::Variable<long>::BPInfo,_std::allocator<adios2::core::Variable<long>::BPInfo>_>
    ::_M_move_assign(&coreBlocks,
                     (vector<adios2::core::Variable<long>::BPInfo,_std::allocator<adios2::core::Variable<long>::BPInfo>_>
                      *)ndigits_dims);
    std::
    vector<adios2::core::Variable<long>::BPInfo,_std::allocator<adios2::core::Variable<long>::BPInfo>_>
    ::~vector((vector<adios2::core::Variable<long>::BPInfo,_std::allocator<adios2::core::Variable<long>::BPInfo>_>
               *)ndigits_dims);
    lVar18 = 0x1a0;
    pBVar8 = coreBlocks.
             super__Vector_base<adios2::core::Variable<long>::BPInfo,_std::allocator<adios2::core::Variable<long>::BPInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pBVar11 = coreBlocks.
              super__Vector_base<adios2::core::Variable<long>::BPInfo,_std::allocator<adios2::core::Variable<long>::BPInfo>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (coreBlocks.
        super__Vector_base<adios2::core::Variable<long>::BPInfo,_std::allocator<adios2::core::Variable<long>::BPInfo>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        coreBlocks.
        super__Vector_base<adios2::core::Variable<long>::BPInfo,_std::allocator<adios2::core::Variable<long>::BPInfo>_>
        ._M_impl.super__Vector_impl_data._M_finish) goto LAB_00132594;
  }
  else {
    lVar18 = 0x50;
    pBVar8 = *(pointer *)((long)pvVar7 + 0x28);
    pBVar11 = *(pointer *)((long)pvVar7 + 0x20);
  }
  uVar9 = ((long)pBVar8 - (long)pBVar11) / lVar18;
  uVar4 = ndigits(uVar9 - 1);
  if ((*(int *)(variable + 0x40) == 4) || (*(int *)(variable + 0x40) == 1)) {
    if (dump == '\x01') {
      iVar5 = ncols;
      if (adiosvartype == String) {
        iVar5 = 1;
      }
      lVar18 = 0xf8;
      iVar16 = 0;
      for (uVar15 = 0; uVar9 != uVar15; uVar15 = uVar15 + 1) {
        if ((iVar16 == 0) && (noindex == '\0')) {
          fprintf(outf,"    (%*zu)    ",(ulong)uVar4,uVar15);
        }
        if (pvVar7 == (void *)0x0) {
          data_00 = &(coreBlocks.
                      super__Vector_base<adios2::core::Variable<long>::BPInfo,_std::allocator<adios2::core::Variable<long>::BPInfo>_>
                      ._M_impl.super__Vector_impl_data._M_start)->StepBlockSubStreamsInfo + lVar18;
        }
        else {
          data_00 = (map<unsigned_long,_std::vector<adios2::helper::SubStreamBoxInfo,_std::allocator<adios2::helper::SubStreamBoxInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubStreamBoxInfo,_std::allocator<adios2::helper::SubStreamBoxInfo>_>_>_>_>
                     *)(*(long *)((long)pvVar7 + 0x20) + uVar15 * 0x50 + 0x40);
        }
        print_data(data_00,0,adiosvartype,true,false);
        iVar16 = iVar16 + 1;
        if (uVar15 < uVar9 - 1) {
          __c = 0x20;
          if (iVar5 <= iVar16) {
            iVar16 = 0;
            __c = 10;
          }
          fputc(__c,outf);
        }
        lVar18 = lVar18 + 0x1a0;
      }
      fputc(10,outf);
    }
  }
  else {
    lVar18 = *(long *)(variable + 0x90);
    lVar3 = *(long *)(variable + 0x88);
    puVar13 = &DAT_00160110;
    piVar14 = ndigits_dims;
    for (lVar12 = 0x10; lVar12 != 0; lVar12 = lVar12 + -1) {
      *(undefined8 *)piVar14 = *puVar13;
      puVar13 = puVar13 + (ulong)bVar19 * -2 + 1;
      piVar14 = piVar14 + (ulong)bVar19 * -4 + 2;
    }
    pVVar2 = variable + 0x88;
    pVVar1 = variable + 0x58;
    for (lVar12 = 0; lVar18 - lVar3 >> 3 != lVar12; lVar12 = lVar12 + 1) {
      pVVar10 = pVVar2;
      if (*(int *)(variable + 0x40) == 2) {
        pVVar10 = pVVar1;
      }
      iVar5 = ndigits(*(long *)(*(long *)pVVar10 + lVar12 * 8) - 1);
      ndigits_dims[lVar12] = iVar5;
    }
    this = (_Vector_base<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_> *)
           ((long)pvVar7 + 0x20);
    for (blockid = 0; blockid != uVar9; blockid = blockid + 1) {
      fprintf(outf,"%c         block %*zu: [",(ulong)(uint)(int)commentchar);
      uVar15 = *(long *)(variable + 0x90) - *(long *)(variable + 0x88) >> 3;
      lVar18 = blockid * 0x50;
      for (uVar17 = 0; uVar15 != uVar17; uVar17 = uVar17 + 1) {
        if (pvVar7 == (void *)0x0) {
          if (coreBlocks.
              super__Vector_base<adios2::core::Variable<long>::BPInfo,_std::allocator<adios2::core::Variable<long>::BPInfo>_>
              ._M_impl.super__Vector_impl_data._M_start[blockid].Count.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[uVar17] == 0) goto LAB_001322d6;
          uVar4 = ndigits_dims[uVar17];
          if (*(int *)(variable + 0x40) != 2) goto LAB_001322fc;
LAB_001322b5:
          fprintf(outf,"%*zu:%*zu");
        }
        else {
          if (*(long *)(*(long *)((this->_M_impl).super__Vector_impl_data._M_start + lVar18 + 0x18)
                       + uVar17 * 8) == 0) {
LAB_001322d6:
            uVar4 = ndigits_dims[uVar17] * 2 + 1;
            __format = "%-*s";
          }
          else {
            uVar4 = ndigits_dims[uVar17];
            if (*(int *)(variable + 0x40) == 2) goto LAB_001322b5;
LAB_001322fc:
            __format = "0:%*zu";
          }
          fprintf(outf,__format,(ulong)uVar4);
        }
        if (uVar17 < uVar15 - 1) {
          fwrite(", ",2,1,outf);
        }
      }
      fputc(0x5d,outf);
      if (longopt != '\0') {
        fwrite(" = ",3,1,outf);
        if (pvVar7 == (void *)0x0) {
          print_data(&coreBlocks.
                      super__Vector_base<adios2::core::Variable<long>::BPInfo,_std::allocator<adios2::core::Variable<long>::BPInfo>_>
                      ._M_impl.super__Vector_impl_data._M_start[blockid].Min,0,adiosvartype,false,
                     false);
          fwrite(" / ",3,1,outf);
          data = (pointer)&coreBlocks.
                           super__Vector_base<adios2::core::Variable<long>::BPInfo,_std::allocator<adios2::core::Variable<long>::BPInfo>_>
                           ._M_impl.super__Vector_impl_data._M_start[blockid].Max;
        }
        else {
          print_data((this->_M_impl).super__Vector_impl_data._M_start + lVar18 + 0x20,0,adiosvartype
                     ,false,false);
          fwrite(" / ",3,1,outf);
          data = (this->_M_impl).super__Vector_impl_data._M_start + lVar18 + 0x30;
        }
        print_data(data,0,adiosvartype,false,false);
      }
      fputc(10,outf);
      if ((pvVar7 == (void *)0x0) && (dump != '\0')) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_d0,
                   &coreBlocks.
                    super__Vector_base<adios2::core::Variable<long>::BPInfo,_std::allocator<adios2::core::Variable<long>::BPInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start[blockid].Count);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_e8,
                   &coreBlocks.
                    super__Vector_base<adios2::core::Variable<long>::BPInfo,_std::allocator<adios2::core::Variable<long>::BPInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start[blockid].Start);
        Start.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffeb0;
        Start.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)&local_e8;
        Start.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_4_ = (int)variable;
        Start.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ = (int)((ulong)variable >> 0x20);
        readVarBlock<long>(fp,io,variable,0,blockid,(Dims *)&local_d0,Start);
        std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_e8);
        std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_d0);
      }
    }
    if (pvVar7 != (void *)0x0) {
      std::_Vector_base<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>::~_Vector_base
                (this);
      operator_delete(pvVar7);
    }
  }
LAB_00132594:
  std::
  vector<adios2::core::Variable<long>::BPInfo,_std::allocator<adios2::core::Variable<long>::BPInfo>_>
  ::~vector(&coreBlocks);
  return;
}

Assistant:

void print_decomp_singlestep(core::Engine *fp, core::IO *io, core::Variable<T> *variable)
{
    /* Print block info */
    DataType adiosvartype = variable->m_Type;
    const auto minBlocks = fp->MinBlocksInfo(*variable, fp->CurrentStep());

    std::vector<typename core::Variable<T>::BPInfo> coreBlocks;

    if (!minBlocks)
    {
        coreBlocks = fp->BlocksInfo(*variable, fp->CurrentStep());
    }
    if (!minBlocks && coreBlocks.empty())
    {
        return;
    }

    size_t blocksSize;
    if (minBlocks)
    {
        blocksSize = minBlocks->BlocksInfo.size();
    }
    else
    {
        blocksSize = coreBlocks.size();
    }
    const int ndigits_nblocks = ndigits(blocksSize - 1);

    if (variable->m_ShapeID == ShapeID::GlobalValue || variable->m_ShapeID == ShapeID::LocalValue)
    {
        // scalars
        if (dump)
        {
            int col = 0;
            int maxcols = ncols;
            if (adiosvartype == DataType::String)
            {
                maxcols = 1;
            }
            for (size_t j = 0; j < blocksSize; j++)
            {
                if (col == 0 && !noindex)
                {
                    fprintf(outf, "    (%*zu)    ", ndigits_nblocks, j);
                }
                if (!minBlocks)
                    print_data(&coreBlocks[j].Value, 0, adiosvartype, true);
                else
                    print_data(&minBlocks->BlocksInfo[j].BufferP, 0, adiosvartype, true);
                ++col;
                if (j < blocksSize - 1)
                {
                    if (col < maxcols)
                    {
                        fprintf(outf, " ");
                    }
                    else
                    {
                        col = 0;
                        fprintf(outf, "\n");
                    }
                }
            }
            fprintf(outf, "\n");
        }
        return;
    }
    else
    {
        // arrays
        size_t ndim = variable->m_Count.size();
        int ndigits_dims[32] = {
            8, 8, 8, 8, 8, 8, 8, 8, 8, 8, 8, 8, 8, 8, 8, 8,
            8, 8, 8, 8, 8, 8, 8, 8, 8, 8, 8, 8, 8, 8, 8, 8,
        };
        for (size_t k = 0; k < ndim; k++)
        {
            // get digit lengths for each dimension
            if (variable->m_ShapeID == ShapeID::GlobalArray)
            {
                ndigits_dims[k] = ndigits(variable->m_Shape[k] - 1);
            }
            else
            {
                ndigits_dims[k] = ndigits(variable->m_Count[k] - 1);
            }
        }

        size_t stepRelative = 0;

        for (size_t j = 0; j < blocksSize; j++)
        {
            fprintf(outf, "%c         block %*zu: [", commentchar, ndigits_nblocks, j);

            // just in case ndim for a block changes in LocalArrays:
            ndim = variable->m_Count.size();

            for (size_t k = 0; k < ndim; k++)
            {
                if (!minBlocks)
                {
                    if (coreBlocks[j].Count[k])
                    {
                        if (variable->m_ShapeID == ShapeID::GlobalArray)
                        {
                            fprintf(outf, "%*zu:%*zu", ndigits_dims[k], coreBlocks[j].Start[k],
                                    ndigits_dims[k],
                                    coreBlocks[j].Start[k] + coreBlocks[j].Count[k] - 1);
                        }
                        else
                        {
                            // blockStart is empty vector for LocalArrays
                            fprintf(outf, "0:%*zu", ndigits_dims[k], coreBlocks[j].Count[k] - 1);
                        }
                    }
                    else
                    {
                        fprintf(outf, "%-*s", 2 * ndigits_dims[k] + 1, "null");
                    }
                }
                else
                {
                    if (minBlocks->BlocksInfo[j].Count[k])
                    {
                        if (variable->m_ShapeID == ShapeID::GlobalArray)
                        {
                            fprintf(outf, "%*zu:%*zu", ndigits_dims[k],
                                    minBlocks->BlocksInfo[j].Start[k], ndigits_dims[k],
                                    minBlocks->BlocksInfo[j].Start[k] +
                                        minBlocks->BlocksInfo[j].Count[k] - 1);
                        }
                        else
                        {
                            // blockStart is empty vector for LocalArrays
                            fprintf(outf, "0:%*zu", ndigits_dims[k],
                                    minBlocks->BlocksInfo[j].Count[k] - 1);
                        }
                    }
                    else
                    {
                        fprintf(outf, "%-*s", 2 * ndigits_dims[k] + 1, "null");
                    }
                }
                if (k < ndim - 1)
                    fprintf(outf, ", ");
            }
            fprintf(outf, "]");

            /* Print per-block statistics if available */
            if (longopt)
            {
                if (true /* TODO: variable->has_minmax */)
                {
                    if (!minBlocks)
                    {
                        fprintf(outf, " = ");
                        print_data(&coreBlocks[j].Min, 0, adiosvartype, false);

                        fprintf(outf, " / ");
                        print_data(&coreBlocks[j].Max, 0, adiosvartype, false);
                    }
                    else
                    {
                        fprintf(outf, " = ");
                        print_data(&minBlocks->BlocksInfo[j].MinMax.MinUnion, 0, adiosvartype,
                                   false);

                        fprintf(outf, " / ");
                        print_data(&minBlocks->BlocksInfo[j].MinMax.MaxUnion, 0, adiosvartype,
                                   false);
                    }
                }
                else
                {
                    fprintf(outf, "N/A / N/A");
                }
            }
            fprintf(outf, "\n");
            if (dump)
            {
                if (!minBlocks)
                {
                    readVarBlock(fp, io, variable, stepRelative, j, coreBlocks[j].Count,
                                 coreBlocks[j].Start);
                }
                else
                {
                    // GSE todo
                }
            }
        }
        ++stepRelative;
    }
    if (minBlocks)
        delete minBlocks;
}